

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

pair<bool,_int> Fixpp::impl::matchTag<Fixpp::TagT<9u,Fixpp::Type::Int>,int>(StreamCursor *cursor)

{
  bool bVar1;
  bool local_7d;
  int local_7c;
  bool local_75;
  Return local_74;
  int local_70;
  int ret;
  int local_68;
  bool local_61 [5];
  int local_5c;
  bool local_55 [17];
  int local_44;
  undefined1 local_40 [4];
  int tag;
  Revert revert;
  StreamCursor *cursor_local;
  
  revert._32_8_ = cursor;
  StreamCursor::Revert::Revert((Revert *)local_40,cursor);
  bVar1 = match_int_fast(&local_44,(StreamCursor *)revert._32_8_);
  if (bVar1) {
    if (local_44 == 9) {
      bVar1 = match_literal_fast('=',(StreamCursor *)revert._32_8_);
      if (bVar1) {
        bVar1 = TagMatcher<Fixpp::Type::Int>::matchValue(&local_74,(StreamCursor *)revert._32_8_);
        if (bVar1) {
          StreamCursor::Revert::ignore((Revert *)local_40);
          local_7d = true;
          cursor_local = (StreamCursor *)std::make_pair<bool,int&>(&local_7d,&local_74);
        }
        else {
          local_75 = false;
          local_7c = 0;
          cursor_local = (StreamCursor *)std::make_pair<bool,int>(&local_75,&local_7c);
        }
      }
      else {
        ret._3_1_ = 0;
        local_70 = 0;
        cursor_local = (StreamCursor *)std::make_pair<bool,int>((bool *)((long)&ret + 3),&local_70);
      }
    }
    else {
      local_61[0] = false;
      local_68 = 0;
      cursor_local = (StreamCursor *)std::make_pair<bool,int>(local_61,&local_68);
    }
  }
  else {
    local_55[0] = false;
    local_5c = 0;
    cursor_local = (StreamCursor *)std::make_pair<bool,int>(local_55,&local_5c);
  }
  local_61[1] = true;
  local_61[2] = false;
  local_61[3] = false;
  local_61[4] = false;
  StreamCursor::Revert::~Revert((Revert *)local_40);
  return (pair<bool,_int>)cursor_local;
}

Assistant:

std::pair<bool, Ret> matchTag(StreamCursor& cursor)
        {
            #define TRY_MATCH(...) \
            if (!__VA_ARGS__) \
               return std::make_pair(false, Ret {})

            StreamCursor::Revert revert(cursor);

            int tag;
            TRY_MATCH(match_int_fast(&tag, cursor));

            if (tag != Tag::Id)
               return std::make_pair(false, Ret {});

            TRY_MATCH(match_literal_fast('=', cursor));

            Ret ret;

            TRY_MATCH(TagMatcher<typename Tag::Type>::matchValue(&ret, cursor));

            revert.ignore();

            return std::make_pair(true, ret);

            #undef TRY_MATCH
        }